

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CConvertVisitor.cpp
# Opt level: O1

void __thiscall CConvertVisitor::Visit(CConvertVisitor *this,CType *stm)

{
  pointer pcVar1;
  CIdExp *pCVar2;
  mapped_type *pmVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  if (stm->isPrimitive == true) {
    pmVar3 = std::
             map<enums::TPrimitiveType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<enums::TPrimitiveType>,_std::allocator<std::pair<const_enums::TPrimitiveType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&CType::typeNames_abi_cxx11_,&stm->type);
    pcVar1 = (pmVar3->_M_dataplus)._M_p;
    local_38[0] = local_28;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_38,pcVar1,pcVar1 + pmVar3->_M_string_length);
    std::__cxx11::string::append((char *)local_38);
    std::__cxx11::string::_M_append((char *)&this->code,(ulong)local_38[0]);
    if (local_38[0] != local_28) {
      operator_delete(local_38[0]);
    }
    return;
  }
  pCVar2 = (stm->name)._M_t.super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>._M_t.
           super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
           super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl;
  (*(code *)**(undefined8 **)&(pCVar2->super_IExpression).super_PositionedNode)(pCVar2,this);
  std::__cxx11::string::append((char *)&this->code);
  return;
}

Assistant:

void CConvertVisitor::Visit(CType &stm) {
	if (stm.isPrimitive) {
		this->code += CType::typeNames[stm.type] + " ";
	} else {
		stm.name->Accept(*this);
		this->code += " ";
	}
}